

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *p)

{
  pointer puVar1;
  string *psVar2;
  DescriptorPool *this_00;
  FieldDescriptor *this_01;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  pointer pSVar6;
  ServiceDescriptor *this_02;
  MethodDescriptor *this_03;
  Descriptor *pDVar7;
  Descriptor *pDVar8;
  mapped_type *ppDVar9;
  Message *pMVar10;
  Printer *pPVar11;
  reference ppVar12;
  char *pcVar13;
  char *extraout_RDX;
  Options *extraout_RDX_00;
  Reflection *this_04;
  Options *extraout_RDX_01;
  Options *pOVar14;
  long lVar15;
  pointer puVar16;
  Options *in_R9;
  int j;
  int iVar17;
  int i;
  _Alloc_hider _Var18;
  string_view name;
  string_view name_00;
  Metadata MVar19;
  iterator iVar20;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  string_view var;
  string_view filename;
  string_view name_01;
  string_view data;
  initializer_list<const_google::protobuf::Message_*> __l_00;
  Printer *p_local;
  allocator<char> local_952;
  allocator<char> local_951;
  Options *local_950;
  allocator<char> local_945;
  allocator<char> local_944;
  allocator<char> local_943;
  allocator<char> local_942;
  allocator<char> local_941;
  Printer *local_940;
  MessageLite *local_938;
  Printer *local_930;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  size_t num_deps;
  btree_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  res;
  string local_8c8;
  string local_8a8;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  subs;
  char *local_848;
  Arena *local_840;
  char local_838 [8];
  undefined8 uStack_830;
  char *local_828;
  Arena *local_820;
  char local_818 [8];
  undefined8 uStack_810;
  pointer local_808;
  pointer local_800;
  undefined1 local_7f8;
  undefined7 uStack_7f7;
  char *local_7e8;
  Arena *local_7e0;
  char local_7d8 [8];
  undefined8 uStack_7d0;
  pointer local_7c8;
  pointer local_7c0;
  undefined1 local_7b8;
  undefined7 uStack_7b7;
  CrossFileReferences refs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  string desc_name;
  string file_data;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  to_process;
  variant<std::__cxx11::string,std::function<bool()>> local_558 [40];
  char local_530 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520 [6];
  undefined1 local_4c0 [64];
  __index_type local_480;
  _Alloc_hider local_478;
  size_type local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  bool local_458;
  bool local_410;
  Sub local_408;
  Sub local_350;
  Sub local_298;
  Sub local_1e0;
  FileDescriptorProto file_proto;
  
  p_local = p;
  if ((this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->enum_generators_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    io::Printer::Emit(p,0x82,
                      "\n      static constexpr const ::_pb::EnumDescriptor *$nonnull$ *$nullable$\n          $file_level_enum_descriptors$ = nullptr;\n    "
                     );
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_598,"len",(allocator<char> *)&refs);
    file_proto.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)
         ((long)(this->enum_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->enum_generators_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
    io::Printer::Sub::Sub<unsigned_long>((Sub *)&to_process,&local_598,(unsigned_long *)&file_proto)
    ;
    io::Printer::Emit(p,&to_process,1,0xb7,
                      "\n      //~ Default initialized to null, but set to non-null values before use.\n      static const ::_pb::EnumDescriptor* $nonnull$\n          $file_level_enum_descriptors$[$len$];\n    "
                     );
    io::Printer::Sub::~Sub((Sub *)&to_process);
    std::__cxx11::string::~string((string *)&local_598);
  }
  local_950 = &this->options_;
  bVar4 = HasGenericServices(this->file_,local_950);
  pPVar11 = p_local;
  if ((bVar4) && (0 < this->file_->service_count_)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5b8,"len",(allocator<char> *)&refs);
    file_proto.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)
         CONCAT44(file_proto.super_Message.super_MessageLite._vptr_MessageLite._4_4_,
                  this->file_->service_count_);
    io::Printer::Sub::Sub<int>((Sub *)&to_process,&local_5b8,(int *)&file_proto);
    io::Printer::Emit(pPVar11,&to_process,1,0xbd,
                      "\n      //~ Default initialized to null, but set to non-null values before use.\n      static const ::_pb::ServiceDescriptor* $nonnull$\n          $file_level_service_descriptors$[$len$];\n    "
                     );
    io::Printer::Sub::~Sub((Sub *)&to_process);
    std::__cxx11::string::~string((string *)&local_5b8);
  }
  else {
    io::Printer::Emit(p_local,0x88,
                      "\n      static constexpr const ::_pb::ServiceDescriptor *$nonnull$ *$nullable$\n          $file_level_service_descriptors$ = nullptr;\n    "
                     );
  }
  puVar16 = (this->message_generators_).
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar16 == puVar1) {
    io::Printer::Emit(p_local,0xf7,
                      "\n      const ::uint32_t $tablename$::offsets[1] = {};\n      static constexpr ::_pbi::MigrationSchema* $nullable$ schemas = nullptr;\n      static constexpr ::_pb::Message* $nonnull$ const* $nullable$\n          file_default_instances = nullptr;\n    "
                     );
  }
  else {
    refs.weak_default_instances.
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.size_ = 0;
    refs.weak_default_instances.
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.root_ = (node_type *)0x0;
    refs.weak_default_instances.
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.rightmost_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
    .
    super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
    .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
              )(Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
                )0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&refs,
               (long)puVar1 - (long)puVar16 >> 3);
    pPVar11 = p_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c8,"offsets",(allocator<char> *)&subs);
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&to_process.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_7c8 != (pointer)&local_7b8) {
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = local_7c8;
    }
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_7b7,local_7b8);
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_7c0;
    local_7c0 = (pointer)0x0;
    local_7b8 = 0;
    file_proto.field_0._0_8_ = 0;
    file_proto.field_0._impl_.dependency_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
         (void *)0x0;
    file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
    file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
    local_7c8 = (pointer)&local_7b8;
    file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)operator_new(0x20);
    *file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int *)this;
    file_proto.super_Message.super_MessageLite._vptr_MessageLite[1] = (_func_int *)&refs;
    file_proto.super_Message.super_MessageLite._vptr_MessageLite[2] = (_func_int *)&p_local;
    *(undefined1 *)(file_proto.super_Message.super_MessageLite._vptr_MessageLite + 3) = 0;
    file_proto.field_0._impl_.dependency_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_invoke;
    file_proto.field_0._0_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_558,(function<bool_()> *)&file_proto);
    std::_Function_base::~_Function_base((_Function_base *)&file_proto);
    local_530[8] = '\0';
    local_530[9] = '\0';
    local_530[10] = '\0';
    local_530[0xb] = '\0';
    local_530[0xc] = '\0';
    local_530[0xd] = '\0';
    local_530[0xe] = '\0';
    local_530[0xf] = '\0';
    local_520[0]._M_local_buf[0] = '\0';
    local_520[1]._0_1_ = false;
    local_530._0_8_ = local_520;
    if (local_558[0x20] == (variant<std::__cxx11::string,std::function<bool()>>)0x1) {
      std::__cxx11::string::assign(local_530);
    }
    local_520[5]._8_1_ = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e8,"schemas",(allocator<char> *)&fields);
    local_4c0._0_8_ = local_4c0 + 0x10;
    if (local_7e8 == local_7d8) {
      local_4c0._24_8_ = uStack_7d0;
    }
    else {
      local_4c0._0_8_ = local_7e8;
    }
    local_4c0._8_8_ = local_7e0;
    local_7e0 = (Arena *)0x0;
    local_7d8[0] = '\0';
    file_proto.field_0._0_8_ = 0;
    file_proto.field_0._impl_.dependency_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
         (void *)0x0;
    file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
    file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
    local_7e8 = local_7d8;
    file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)operator_new(0x20);
    *file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int *)this;
    file_proto.super_Message.super_MessageLite._vptr_MessageLite[1] = (_func_int *)&p_local;
    file_proto.super_Message.super_MessageLite._vptr_MessageLite[2] = (_func_int *)&refs;
    *(undefined1 *)(file_proto.super_Message.super_MessageLite._vptr_MessageLite + 3) = 0;
    file_proto.field_0._impl_.dependency_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_invoke;
    file_proto.field_0._0_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_4c0 + 0x20),
               (function<bool_()> *)&file_proto);
    std::_Function_base::~_Function_base((_Function_base *)&file_proto);
    local_478._M_p = (pointer)&local_468;
    local_470 = 0;
    local_468._M_local_buf[0] = '\0';
    local_458 = false;
    if (local_480 == '\x01') {
      std::__cxx11::string::assign((char *)&local_478);
    }
    local_410 = false;
    io::Printer::Emit(pPVar11,&to_process,2,0x160,
                      "\n          const ::uint32_t\n              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n                  protodesc_cold) = {\n                  $offsets$,\n          };\n\n          static const ::_pbi::MigrationSchema\n              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {\n                  $schemas$,\n          };\n        "
                     );
    lVar15 = 0xb8;
    do {
      io::Printer::Sub::~Sub
                ((Sub *)((long)&to_process.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar15));
      lVar15 = lVar15 + -0xb8;
    } while (lVar15 != -0xb8);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::__cxx11::string::~string((string *)&local_7c8);
    bVar4 = UsingImplicitWeakDescriptor(this->file_,local_950);
    if (!bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,"defaults",(allocator<char> *)&fields);
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&to_process.
                     super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_808 != (pointer)&local_7f8) {
        to_process.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_start = local_808;
      }
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_7f7,local_7f8);
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_800;
      local_800 = (pointer)0x0;
      local_7f8 = 0;
      file_proto.field_0._0_8_ = 0;
      file_proto.field_0._impl_.dependency_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
           (void *)0x0;
      file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
      file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
      local_808 = (pointer)&local_7f8;
      file_proto.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)operator_new(0x18);
      *file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int *)this;
      file_proto.super_Message.super_MessageLite._vptr_MessageLite[1] = (_func_int *)&p_local;
      *(undefined1 *)(file_proto.super_Message.super_MessageLite._vptr_MessageLite + 2) = 0;
      file_proto.field_0._impl_.dependency_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_invoke;
      file_proto.field_0._0_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_558,(function<bool_()> *)&file_proto);
      std::_Function_base::~_Function_base((_Function_base *)&file_proto);
      local_530[8] = '\0';
      local_530[9] = '\0';
      local_530[10] = '\0';
      local_530[0xb] = '\0';
      local_530[0xc] = '\0';
      local_530[0xd] = '\0';
      local_530[0xe] = '\0';
      local_530[0xf] = '\0';
      local_520[0]._M_local_buf[0] = '\0';
      local_520[1]._0_1_ = false;
      local_530._0_8_ = local_520;
      if (local_558[0x20] == (variant<std::__cxx11::string,std::function<bool()>>)0x1) {
        std::__cxx11::string::assign(local_530);
      }
      local_520[5]._8_1_ = false;
      __l._M_len = 1;
      __l._M_array = (iterator)&to_process;
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::vector(&subs,__l,(allocator_type *)&file_proto);
      io::Printer::Sub::~Sub((Sub *)&to_process);
      std::__cxx11::string::~string((string *)&local_808);
      io::Printer::Emit(p_local,subs.
                                super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                        ((long)subs.
                               super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)subs.
                              super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xb8,0x74,
                        "\n      static const ::_pb::Message* $nonnull$ const file_default_instances[] = {\n          $defaults$,\n      };\n    "
                       );
      std::
      vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ::~vector(&subs);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&refs);
  }
  StripSourceRetentionOptions(&file_proto,this->file_,false);
  file_data._M_dataplus._M_p = (pointer)&file_data.field_2;
  file_data._M_string_length = 0;
  file_data.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&file_proto,&file_data);
  name._M_str = (char *)this->file_;
  name._M_len = (size_t)"descriptor_table_protodef";
  UniqueName_abi_cxx11_(&desc_name,(cpp *)0x19,name,(FileDescriptor *)local_950,in_R9);
  pPVar11 = p_local;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"desc_name",(allocator<char> *)&subs);
  io::Printer::Sub::Sub<std::__cxx11::string&>((Sub *)&to_process,&local_5d8,&desc_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_828,"encoded_file_proto",(allocator<char> *)&fields);
  local_4c0._0_8_ = local_4c0 + 0x10;
  if (local_828 == local_818) {
    local_4c0._24_8_ = uStack_810;
  }
  else {
    local_4c0._0_8_ = local_828;
  }
  local_4c0._8_8_ = local_820;
  local_820 = (Arena *)0x0;
  local_818[0] = '\0';
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)0x0;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)0x0;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )(Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
              )0x0;
  local_828 = local_818;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)operator_new(0x20);
  *(FileGenerator **)
   refs.weak_default_instances.
   super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
   .
   super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
   .tree_.root_ = this;
  *(Printer ***)
   (refs.weak_default_instances.
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.root_ + 8) = &p_local;
  *(string **)
   (refs.weak_default_instances.
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
    .tree_.root_ + 0x10) = &file_data;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_[0x18] = (node_type)0x0;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_4c0 + 0x20),
             (function<bool_()> *)&refs);
  std::_Function_base::~_Function_base((_Function_base *)&refs);
  local_470 = 0;
  local_468._M_local_buf[0] = '\0';
  local_458 = false;
  local_478._M_p = (pointer)&local_468;
  if (local_480 == '\x01') {
    std::__cxx11::string::assign((char *)&local_478);
  }
  local_410 = false;
  io::Printer::Emit(pPVar11,&to_process,2,0x96,
                    "\n        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n            protodesc_cold) = {\n            $encoded_file_proto$,\n        };\n      "
                   );
  lVar15 = 0xb8;
  do {
    io::Printer::Sub::~Sub
              ((Sub *)((long)&to_process.
                              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar15));
    lVar15 = lVar15 + -0xb8;
  } while (lVar15 != -0xb8);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_5d8);
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::Descriptor_*>::checked_compare,_std::allocator<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Descriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::Descriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  refs.weak_default_instances.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  refs.strong_reflection_files.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  refs.weak_reflection_files.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  refs.weak_reflection_files.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_const_google::protobuf::FileDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  refs.weak_reflection_files.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  GetCrossFileReferencesForFile(this,this->file_,&refs);
  pPVar11 = p_local;
  num_deps = refs.weak_reflection_files.
             super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
             .
             super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
             .tree_.size_ +
             refs.strong_reflection_files.
             super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
             .
             super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
             .tree_.size_;
  if (num_deps != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5f8,"len",(allocator<char> *)&fields);
    io::Printer::Sub::Sub<unsigned_long&>((Sub *)&to_process,&local_5f8,&num_deps);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_848,"deps",(allocator<char> *)&res);
    local_4c0._0_8_ = local_4c0 + 0x10;
    if (local_848 == local_838) {
      local_4c0._24_8_ = uStack_830;
    }
    else {
      local_4c0._0_8_ = local_848;
    }
    local_4c0._8_8_ = local_840;
    local_840 = (Arena *)0x0;
    local_838[0] = '\0';
    subs.
    super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    subs.
    super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
    local_848 = local_838;
    pSVar6 = (pointer)operator_new(0x20);
    (pSVar6->key_)._M_dataplus._M_p = (pointer)&refs;
    (pSVar6->key_)._M_string_length = (size_type)&p_local;
    (pSVar6->key_).field_2._M_allocated_capacity = (size_type)this;
    (pSVar6->key_).field_2._M_local_buf[8] = '\0';
    subs.
    super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ._M_impl.super__Vector_impl_data._M_start = pSVar6;
    subs.
    super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_4c0 + 0x20),
               (function<bool_()> *)&subs);
    std::_Function_base::~_Function_base((_Function_base *)&subs);
    local_470 = 0;
    local_468._M_local_buf[0] = '\0';
    local_458 = false;
    local_478._M_p = (pointer)&local_468;
    if (local_480 == '\x01') {
      std::__cxx11::string::assign((char *)&local_478);
    }
    local_410 = false;
    io::Printer::Emit(pPVar11,&to_process,2,0x9b,
                      "\n          static const ::_pbi::DescriptorTable* $nonnull$ const\n              $desc_table$_deps[$len$] = {\n                  $deps$,\n          };\n        "
                     );
    lVar15 = 0xb8;
    do {
      io::Printer::Sub::~Sub
                ((Sub *)((long)&to_process.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar15));
      lVar15 = lVar15 + -0xb8;
    } while (lVar15 != -0xb8);
    std::__cxx11::string::~string((string *)&local_848);
    std::__cxx11::string::~string((string *)&local_5f8);
  }
  pPVar11 = p_local;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"eager",&local_951);
  local_8a8._M_dataplus._M_p = "false";
  io::Printer::Sub::Sub<char_const*>((Sub *)&to_process,&local_618,(char **)&local_8a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"file_proto_len",&local_952);
  local_8c8._M_dataplus._M_p = (pointer)file_data._M_string_length;
  if ((this->options_).strip_nonfunctional_codegen != false) {
    local_8c8._M_dataplus._M_p = (pointer)(Message *)0x0;
  }
  io::Printer::Sub::Sub<unsigned_long>((Sub *)local_4c0,&local_638,(unsigned_long *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"proto_name",&local_941);
  io::Printer::Sub::Sub<std::__cxx11::string&>(&local_408,&local_658,&desc_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"deps_ptr",&local_942);
  if (num_deps == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&res,"nullptr",&local_943);
  }
  else {
    var._M_str = "desc_table";
    var._M_len = 10;
    subs.
    super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ._M_impl.super__Vector_impl_data._0_16_ = io::Printer::LookupVar(p_local,var);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._0_16_ = absl::lts_20250127::NullSafeStringView("_deps");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&res,(lts_20250127 *)&subs,(AlphaNum *)&fields,(AlphaNum *)&fields);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_350,&local_678,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"num_deps",&local_944);
  io::Printer::Sub::Sub<unsigned_long&>(&local_298,&local_698,&num_deps);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"num_msgs",&local_945);
  local_758._M_dataplus._M_p =
       (pointer)((long)(this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->message_generators_).
                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  io::Printer::Sub::Sub<unsigned_long>(&local_1e0,&local_6b8,(unsigned_long *)&local_758);
  io::Printer::Emit(pPVar11,&to_process,6,0x226,
                    "\n        static ::absl::once_flag $desc_table$_once;\n        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {\n            false,\n            $eager$,\n            $file_proto_len$,\n            $proto_name$,\n            \"$filename$\",\n            &$desc_table$_once,\n            $deps_ptr$,\n            $num_deps$,\n            $num_msgs$,\n            schemas,\n            file_default_instances,\n            $tablename$::offsets,\n            $file_level_enum_descriptors$,\n            $file_level_service_descriptors$,\n        };\n      "
                   );
  lVar15 = 0x398;
  do {
    io::Printer::Sub::~Sub
              ((Sub *)((long)&to_process.
                              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar15));
    lVar15 = lVar15 + -0xb8;
  } while (lVar15 != -0xb8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_618);
  psVar2 = this->file_->name_;
  filename._M_str = extraout_RDX;
  filename._M_len = (size_t)(psVar2->_M_dataplus)._M_p;
  bVar4 = protobuf::internal::cpp::IsLazilyInitializedFile((cpp *)psVar2->_M_string_length,filename)
  ;
  pOVar14 = extraout_RDX_00;
  if (!bVar4) {
    bVar4 = UsingImplicitWeakDescriptor(this->file_,local_950);
    if (bVar4) {
      local_930 = (Printer *)this->file_;
      res.
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .tree_.root_ = (node_type *)
                     absl::lts_20250127::container_internal::
                     btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
                     ::EmptyNode()::empty_node;
      res.
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .tree_.rightmost_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::StringBtreeDefaultLess,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
      .
      super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*,_2UL,_false>
      .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::StringBtreeDefaultLess,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                )absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
                 ::EmptyNode()::empty_node;
      res.
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
      .tree_.size_ = 0;
      iVar17 = 0;
      while (iVar17 < *(int *)((long)&(local_930->options_).comment_start._M_str + 4)) {
        local_940 = (Printer *)CONCAT44(local_940._4_4_,iVar17);
        this_02 = FileDescriptor::service((FileDescriptor *)local_930,iVar17);
        for (iVar17 = 0; iVar17 < this_02->method_count_; iVar17 = iVar17 + 1) {
          this_03 = ServiceDescriptor::method(this_02,iVar17);
          pDVar7 = MethodDescriptor::input_type(this_03);
          pDVar8 = MethodDescriptor::input_type(this_03);
          pcVar13 = (pDVar8->all_names_).payload_;
          to_process.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)*(ushort *)(pcVar13 + 2);
          to_process.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)(pcVar13 +
                        ~(ulong)to_process.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          ppDVar9 = absl::lts_20250127::container_internal::
                    btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                    ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                              ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                *)&res,(key_arg<std::basic_string_view<char>_> *)&to_process);
          *ppDVar9 = pDVar7;
          pDVar7 = MethodDescriptor::output_type(this_03);
          pDVar8 = MethodDescriptor::output_type(this_03);
          pcVar13 = (pDVar8->all_names_).payload_;
          to_process.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)*(ushort *)(pcVar13 + 2);
          to_process.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)(pcVar13 +
                        ~(ulong)to_process.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          ppDVar9 = absl::lts_20250127::container_internal::
                    btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                    ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                              ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                *)&res,(key_arg<std::basic_string_view<char>_> *)&to_process);
          *ppDVar9 = pDVar7;
        }
        iVar17 = (int)local_940 + 1;
      }
      this_00 = (DescriptorPool *)(local_930->sink_).bytes_written_;
      pDVar7 = FileDescriptorProto::GetDescriptor();
      pcVar13 = (pDVar7->all_names_).payload_;
      name_01._M_len = (ulong)*(ushort *)(pcVar13 + 2);
      name_01._M_str = pcVar13 + ~name_01._M_len;
      pDVar7 = DescriptorPool::FindMessageTypeByName(this_00,name_01);
      if (pDVar7 != (Descriptor *)0x0) {
        DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&subs,this_00);
        pMVar10 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&subs,pDVar7);
        local_938 = &Message::New(pMVar10)->super_MessageLite;
        FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&to_process);
        FileDescriptor::CopyTo((FileDescriptor *)local_930,(FileDescriptorProto *)&to_process);
        MessageLite::SerializeAsString_abi_cxx11_((string *)&fields,(MessageLite *)&to_process);
        data._M_str = (char *)fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start;
        data._M_len = (size_t)fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = MessageLite::ParseFromString(local_938,data);
        if (!bVar4) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_8c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/file.cc"
                     ,0x432,"fd_proto->ParseFromString(linkedin_fd_proto.SerializeAsString())");
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_8c8);
        }
        std::__cxx11::string::~string((string *)&fields);
        FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&to_process);
        fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_938;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&fields;
        std::
        vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ::vector(&to_process,__l_00,(allocator_type *)&local_8c8);
        while (to_process.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               to_process.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
          pMVar10 = to_process.
                    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1];
          to_process.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               to_process.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
          fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          MVar19 = Message::GetMetadata(pMVar10);
          this_04 = MVar19.reflection;
          Reflection::ListFields(this_04,pMVar10,&fields);
          local_930 = (Printer *)
                      fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          pPVar11 = (Printer *)
                    fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          while (pPVar11 != local_930) {
            this_01 = (FieldDescriptor *)(pPVar11->sink_).stream_;
            local_940 = pPVar11;
            if ((this_01->field_0x1 & 8) != 0) {
              MVar19 = Message::GetMetadata(pMVar10);
              local_8c8._M_string_length = (size_type)((MVar19.descriptor)->all_names_).payload_;
              local_8c8._M_dataplus._M_p =
                   (pointer)(ulong)*(ushort *)(local_8c8._M_string_length + 2);
              local_8c8._M_string_length =
                   local_8c8._M_string_length + ~(ulong)local_8c8._M_dataplus._M_p;
              ppDVar9 = absl::lts_20250127::container_internal::
                        btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                        ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                                  ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                    *)&res,(key_arg<std::basic_string_view<char>_> *)&local_8c8);
              *ppDVar9 = MVar19.descriptor;
            }
            pDVar7 = FieldDescriptor::message_type(this_01);
            if (pDVar7 != (Descriptor *)0x0) {
              if ((this_01->field_0x1 & 8) != 0) {
                local_8c8._M_string_length = (size_type)(pDVar7->all_names_).payload_;
                local_8c8._M_dataplus._M_p =
                     (pointer)(ulong)*(ushort *)(local_8c8._M_string_length + 2);
                local_8c8._M_string_length =
                     local_8c8._M_string_length + ~(ulong)local_8c8._M_dataplus._M_p;
                ppDVar9 = absl::lts_20250127::container_internal::
                          btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                          ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                                    ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                      *)&res,(key_arg<std::basic_string_view<char>_> *)&local_8c8);
                *ppDVar9 = pDVar7;
              }
              bVar4 = FieldDescriptor::is_repeated(this_01);
              if (bVar4) {
                for (iVar17 = 0; iVar5 = Reflection::FieldSize(this_04,pMVar10,this_01),
                    iVar17 < iVar5; iVar17 = iVar17 + 1) {
                  local_8c8._M_dataplus._M_p =
                       (pointer)Reflection::GetRepeatedMessage(this_04,pMVar10,this_01,iVar17);
                  std::
                  vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                  ::emplace_back<google::protobuf::Message_const*>
                            ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                              *)&to_process,(Message **)&local_8c8);
                }
              }
              else {
                local_8c8._M_dataplus._M_p =
                     (pointer)Reflection::GetMessage(this_04,pMVar10,this_01,(MessageFactory *)0x0);
                std::
                vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                ::emplace_back<google::protobuf::Message_const*>
                          ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                            *)&to_process,(Message **)&local_8c8);
              }
            }
            pPVar11 = (Printer *)&(local_940->sink_).buffer_;
          }
          std::
          _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::~_Vector_base(&fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         );
        }
        std::
        _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ::~_Vector_base(&to_process.
                         super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       );
        (*local_938->_vptr_MessageLite[1])();
        DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&subs);
      }
      local_8a8._M_dataplus._M_p = (pointer)0x0;
      local_8a8._M_string_length = 0;
      local_8a8.field_2._M_allocated_capacity = 0;
      iVar20 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                        *)&res);
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)iVar20.node_;
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(to_process.
                             super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar20.position_);
      iVar20 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
               ::end((btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                      *)&res);
      subs.
      super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ._M_impl.super__Vector_impl_data._0_12_ = iVar20._0_12_;
      while (bVar4 = absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                     ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                                   *)&to_process,(iterator *)&subs), bVar4) {
        ppVar12 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                  ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                               *)&to_process);
        bVar4 = IsBootstrapProto(local_950,ppVar12->second->file_);
        if (!bVar4) {
          std::
          vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::push_back((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)&local_8a8,&ppVar12->second);
        }
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_&,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_*>
                     *)&to_process);
      }
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
      ::~btree((btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>
                *)&res);
      sVar3 = local_8a8._M_string_length;
      for (_Var18._M_p = local_8a8._M_dataplus._M_p; _Var18._M_p != (pointer)sVar3;
          _Var18._M_p = (pointer)&(((pointer)_Var18._M_p)->key_)._M_string_length) {
        to_process.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)(((pointer)_Var18._M_p)->key_)._M_dataplus._M_p;
        to_process.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)absl::lts_20250127::internal_any_invocable::LocalManagerTrivial;
        to_process.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
        std::
        vector<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>>
        ::emplace_back<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>
                  ((vector<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                    *)(this->static_initializers_ + 1),
                   (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&to_process);
        (*(code *)to_process.
                  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)
                  (1,(AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&to_process,
                   (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&to_process);
      }
      std::
      _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::~_Vector_base((_Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)&local_8a8);
    }
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)absl::lts_20250127::internal_any_invocable::LocalManagerTrivial;
    std::
    vector<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>>
    ::emplace_back<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>
              ((vector<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>,std::allocator<absl::lts_20250127::AnyInvocable<void(google::protobuf::io::Printer*)>>>
                *)(this->static_initializers_ + 1),
               (AnyInvocable<void_(google::protobuf::io::Printer_*)> *)&to_process);
    (*(code *)to_process.
              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(1,&to_process);
    pOVar14 = extraout_RDX_01;
  }
  bVar4 = IsFileDescriptorProto((cpp *)this->file_,(FileDescriptor *)local_950,pOVar14);
  if (bVar4) {
    res.
    super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .tree_.root_ = (node_type *)p_local;
    res.
    super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .
    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .
    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
    .tree_.size_ = 0;
    bVar4 = (this->options_).opensource_runtime != false;
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000006;
    if (bVar4) {
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000010;
    }
    pcVar13 = "proto2";
    if (bVar4) {
      pcVar13 = "google::protobuf";
    }
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar13;
    subs.
    super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ._M_impl.super__Vector_impl_data._0_16_ = absl::lts_20250127::NullSafeStringView("::internal");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&fields,(lts_20250127 *)&to_process,(AlphaNum *)&subs,(AlphaNum *)&subs);
    NamespaceOpener::ChangeTo
              ((NamespaceOpener *)&res,
               fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&fields);
    local_940 = p_local;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"dummy",&local_951);
    name_00._M_str = (char *)this->file_;
    name_00._M_len = (size_t)"dynamic_init_dummy";
    pOVar14 = local_950;
    UniqueName_abi_cxx11_(&local_8c8,(cpp *)0x12,name_00,(FileDescriptor *)local_950,in_R9);
    io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)&to_process,&local_6d8,&local_8c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f8,"initializers",&local_952);
    puVar16 = (this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
    local_758._M_string_length = 0;
    local_758.field_2._M_local_buf[0] = '\0';
    pcVar13 = anon_var_dwarf_651463 + 5;
    for (; puVar16 != puVar1; puVar16 = puVar16 + 1) {
      std::__cxx11::string::append((char *)&local_758,(ulong)pcVar13);
      DefaultInstanceName_abi_cxx11_
                (&local_8a8,
                 (cpp *)((puVar16->_M_t).
                         super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageGenerator_*,_false>
                        ._M_head_impl)->descriptor_,(Descriptor *)local_950,(Options *)0x0,
                 SUB81(pOVar14,0));
      subs.
      super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_8a8._M_dataplus._M_p;
      subs.
      super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_8a8._M_string_length;
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._0_16_ = absl::lts_20250127::NullSafeStringView(".Init();");
      absl::lts_20250127::StrAppend(&local_758,(AlphaNum *)&subs,(AlphaNum *)&fields);
      std::__cxx11::string::~string((string *)&local_8a8);
      pcVar13 = "\n";
    }
    io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_4c0,&local_6f8,&local_758);
    io::Printer::Emit(local_940,&to_process,2,0x1dc,
                      "\n          //~ Emit wants an indented line, so give it a comment to strip.\n#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {\n            $initializers$;\n          }\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          static std::true_type $dummy${\n              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};\n#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n        "
                     );
    lVar15 = 0xb8;
    do {
      io::Printer::Sub::~Sub
                ((Sub *)((long)&to_process.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar15));
      lVar15 = lVar15 + -0xb8;
    } while (lVar15 != -0xb8);
    std::__cxx11::string::~string((string *)&local_758);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::__cxx11::string::~string((string *)&local_6d8);
    NamespaceOpener::~NamespaceOpener((NamespaceOpener *)&res);
  }
  CrossFileReferences::~CrossFileReferences(&refs);
  std::__cxx11::string::~string((string *)&desc_name);
  std::__cxx11::string::~string((string *)&file_data);
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* p) {
  if (!enum_generators_.empty()) {
    p->Emit({{"len", enum_generators_.size()}}, R"cc(
      //~ Default initialized to null, but set to non-null values before use.
      static const ::_pb::EnumDescriptor* $nonnull$
          $file_level_enum_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::EnumDescriptor *$nonnull$ *$nullable$
          $file_level_enum_descriptors$ = nullptr;
    )cc");
  }

  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    p->Emit({{"len", file_->service_count()}}, R"cc(
      //~ Default initialized to null, but set to non-null values before use.
      static const ::_pb::ServiceDescriptor* $nonnull$
          $file_level_service_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::ServiceDescriptor *$nonnull$ *$nullable$
          $file_level_service_descriptors$ = nullptr;
    )cc");
  }

  if (!message_generators_.empty()) {
    std::vector<size_t> offsets;
    offsets.reserve(message_generators_.size());

    p->Emit(
        {
            {"offsets",
             [&] {
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 offsets.push_back(message_generators_[i]->GenerateOffsets(p));
               }
             }},
            {"schemas",
             [&] {
               int offset = 0;
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 message_generators_[i]->GenerateSchema(p, offset);
                 offset += offsets[i];
               }
             }},
        },
        R"cc(
          const ::uint32_t
              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
                  protodesc_cold) = {
                  $offsets$,
          };

          static const ::_pbi::MigrationSchema
              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {
                  $schemas$,
          };
        )cc");
    constexpr absl::string_view file_default_instances_code = R"cc(
      static const ::_pb::Message* $nonnull$ const file_default_instances[] = {
          $defaults$,
      };
    )cc";
    if (!UsingImplicitWeakDescriptor(file_, options_)) {
      std::vector<Sub> subs = {
          {"defaults", [&] {
             for (auto& gen : message_generators_) {
               p->Emit(
                   {
                       {"ns", Namespace(gen->descriptor(), options_)},
                       {"class", ClassName(gen->descriptor())},
                   },
                   R"cc(
                     &$ns$::_$class$_default_instance_._instance,
                   )cc");
             }
           }}};
      p->Emit(subs, file_default_instances_code);
    }
  } else {
    // Ee still need these symbols to exist.
    //
    // MSVC doesn't like empty arrays, so we add a dummy.
    p->Emit(R"cc(
      const ::uint32_t $tablename$::offsets[1] = {};
      static constexpr ::_pbi::MigrationSchema* $nullable$ schemas = nullptr;
      static constexpr ::_pb::Message* $nonnull$ const* $nullable$
          file_default_instances = nullptr;
    )cc");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.

  FileDescriptorProto file_proto = StripSourceRetentionOptions(*file_);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  auto desc_name = UniqueName("descriptor_table_protodef", file_, options_);
  p->Emit(
      {{"desc_name", desc_name},
       {"encoded_file_proto",
        [&] {
          if (options_.strip_nonfunctional_codegen) {
            p->Emit(R"cc("")cc");
            return;
          }

          absl::string_view data = file_data;
          if (data.size() <= 65535) {
            static constexpr size_t kBytesPerLine = 40;
            while (!data.empty()) {
              auto to_write = std::min(kBytesPerLine, data.size());
              auto chunk = data.substr(0, to_write);
              data = data.substr(to_write);

              p->Emit({{"text", EscapeTrigraphs(absl::CEscape(chunk))}}, R"cc(
                "$text$"
              )cc");
            }
            return;
          }

          // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
          // 65535 bytes in length". Declare a static array of chars rather than
          // use a string literal. Only write 25 bytes per line.
          static constexpr size_t kBytesPerLine = 25;
          while (!data.empty()) {
            auto to_write = std::min(kBytesPerLine, data.size());
            auto chunk = data.substr(0, to_write);
            data = data.substr(to_write);

            std::string line;
            for (char c : chunk) {
              absl::StrAppend(&line, "'",
                              absl::CEscape(absl::string_view(&c, 1)), "', ");
            }

            p->Emit({{"line", line}}, R"cc(
              $line$
            )cc");
          }
        }}},
      R"cc(
        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
            protodesc_cold) = {
            $encoded_file_proto$,
        };
      )cc");

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  size_t num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    p->Emit(
        {
            {"len", num_deps},
            {"deps",
             [&] {
               for (auto dep : refs.strong_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
               for (auto dep : refs.weak_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
             }},
        },
        R"cc(
          static const ::_pbi::DescriptorTable* $nonnull$ const
              $desc_table$_deps[$len$] = {
                  $deps$,
          };
        )cc");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  p->Emit(
      {
          {"eager", eager ? "true" : "false"},
          {"file_proto_len",
           options_.strip_nonfunctional_codegen ? 0 : file_data.size()},
          {"proto_name", desc_name},
          {"deps_ptr", num_deps == 0
                           ? "nullptr"
                           : absl::StrCat(p->LookupVar("desc_table"), "_deps")},
          {"num_deps", num_deps},
          {"num_msgs", message_generators_.size()},
      },
      R"cc(
        static ::absl::once_flag $desc_table$_once;
        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {
            false,
            $eager$,
            $file_proto_len$,
            $proto_name$,
            "$filename$",
            &$desc_table$_once,
            $deps_ptr$,
            $num_deps$,
            $num_msgs$,
            schemas,
            file_default_instances,
            $tablename$::offsets,
            $file_level_enum_descriptors$,
            $file_level_service_descriptors$,
        };
      )cc");

  // For descriptor.proto and cpp_features.proto we want to avoid doing any
  // dynamic initialization, because in some situations that would otherwise
  // pull in a lot of unnecessary code that can't be stripped by --gc-sections.
  // Descriptor initialization will still be performed lazily when it's needed.
  if (!IsLazilyInitializedFile(file_->name())) {
    if (UsingImplicitWeakDescriptor(file_, options_)) {
      for (auto* pinned :
           GetMessagesToPinGloballyForWeakDescriptors(file_, options_)) {
        static_initializers_[kInitPriority102].push_back([this,
                                                          pinned](auto* p) {
          p->Emit({{"pin", StrongReferenceToType(pinned, options_)}},
                  R"cc(
                    $pin$,
                  )cc");
        });
      }
    }
    static_initializers_[kInitPriority102].push_back([](auto* p) {
      p->Emit(R"cc(
        ::_pbi::AddDescriptors(&$desc_table$),
      )cc");
    });
  }

  // However, we must provide a way to force initialize the default instances
  // of FileDescriptorProto which will be used during registration of other
  // files.
  if (IsFileDescriptorProto(file_, options_)) {
    NamespaceOpener ns(p);
    ns.ChangeTo(absl::StrCat(ProtobufNamespace(options_), "::internal"));
    p->Emit(
        {{"dummy", UniqueName("dynamic_init_dummy", file_, options_)},
         {"initializers", absl::StrJoin(message_generators_, "\n",
                                        [&](std::string* out, const auto& gen) {
                                          absl::StrAppend(
                                              out,
                                              DefaultInstanceName(
                                                  gen->descriptor(), options_),
                                              ".Init();");
                                        })}},
        R"cc(
          //~ Emit wants an indented line, so give it a comment to strip.
#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {
            $initializers$;
          }
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          static std::true_type $dummy${
              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};
#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
        )cc");
  }
}